

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void FunctionalTester<unsigned_short,_void>::Test(void)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  ulong x;
  ulong uVar11;
  char *tmp_finish;
  undefined1 auStack_144 [68];
  undefined1 *puStack_100;
  char acStack_f8 [8];
  buf_t buf2;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char> local_b0;
  byte local_98;
  char local_97;
  char local_96;
  char local_95 [5];
  buf_t buf1;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  TestWatcher<unsigned_short> local_31 [8];
  TestWatcher<unsigned_short> tw;
  
  puStack_100 = (undefined1 *)0x10665b;
  TestWatcher<unsigned_short>::TestWatcher(local_31);
  pcVar1 = (char *)((long)&local_50 + 4);
  x = 0;
  do {
    uVar11 = (x >> 2) / 0x19;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = x + uVar11 * -100;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = x;
    if (x < 0x100) {
      cVar7 = (char)x;
      if (x < 100) {
        if (x < 10) {
          local_98 = cVar7 + 0x30;
          pcVar9 = &local_97;
        }
        else {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = x;
          local_98 = (byte)(SUB164(auVar5 * ZEXT816(0xcccccccccccccccd),8) >> 3) | 0x30;
          local_97 = ((byte)(SUB164(auVar3 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5 + '0'
                     + cVar7;
          pcVar9 = &local_96;
        }
      }
      else {
        local_96 = (char)uVar11 * -100 + '0';
        auVar4._8_8_ = 0;
        auVar4._0_8_ = x >> 2;
        local_98 = (byte)(SUB164(auVar4 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) | 0x30;
        uVar11 = uVar11 * -100 + x;
        if (uVar11 < 10) {
          local_97 = '0';
          local_96 = local_96 + cVar7;
        }
        else {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar11;
          local_97 = (char)(SUB164(auVar6 * ZEXT816(0xcccccccccccccccd),8) >> 3) + '0';
          local_96 = local_96 + cVar7 + SUB161(auVar2 * ZEXT816(0x199999999999999a),8) * -10;
        }
        pcVar9 = local_95;
      }
    }
    else {
      puStack_100 = (undefined1 *)0x1066cb;
      pcVar9 = int2str::impl::detail<10000ull>::convert<char*>(x,(char *)&local_98);
    }
    *pcVar9 = '\0';
    buf2._M_elems[0x28] = '\0';
    buf2._M_elems[0x29] = '\0';
    buf2._M_elems[0x2a] = '\0';
    buf2._M_elems[0x2b] = '\0';
    buf2._M_elems[0x2c] = '\0';
    buf2._M_elems[0x2d] = '\0';
    buf2._M_elems[0x2e] = '\0';
    buf2._M_elems[0x2f] = '\0';
    buf2._M_elems[0x30] = '\0';
    buf2._M_elems[0x31] = '\0';
    buf2._M_elems[0x32] = '\0';
    buf2._M_elems[0x33] = '\0';
    buf2._M_elems[0x34] = '\0';
    buf2._M_elems[0x35] = '\0';
    buf2._M_elems[0x36] = '\0';
    buf2._M_elems[0x37] = '\0';
    buf2._M_elems[0x18] = '\0';
    buf2._M_elems[0x19] = '\0';
    buf2._M_elems[0x1a] = '\0';
    buf2._M_elems[0x1b] = '\0';
    buf2._M_elems[0x1c] = '\0';
    buf2._M_elems[0x1d] = '\0';
    buf2._M_elems[0x1e] = '\0';
    buf2._M_elems[0x1f] = '\0';
    buf2._M_elems[0x20] = '\0';
    buf2._M_elems[0x21] = '\0';
    buf2._M_elems[0x22] = '\0';
    buf2._M_elems[0x23] = '\0';
    buf2._M_elems[0x24] = '\0';
    buf2._M_elems[0x25] = '\0';
    buf2._M_elems[0x26] = '\0';
    buf2._M_elems[0x27] = '\0';
    buf2._M_elems[8] = '\0';
    buf2._M_elems[9] = '\0';
    buf2._M_elems[10] = '\0';
    buf2._M_elems[0xb] = '\0';
    buf2._M_elems[0xc] = '\0';
    buf2._M_elems[0xd] = '\0';
    buf2._M_elems[0xe] = '\0';
    buf2._M_elems[0xf] = '\0';
    buf2._M_elems[0x10] = '\0';
    buf2._M_elems[0x11] = '\0';
    buf2._M_elems[0x12] = '\0';
    buf2._M_elems[0x13] = '\0';
    buf2._M_elems[0x14] = '\0';
    buf2._M_elems[0x15] = '\0';
    buf2._M_elems[0x16] = '\0';
    buf2._M_elems[0x17] = '\0';
    acStack_f8[0] = '\0';
    acStack_f8[1] = '\0';
    acStack_f8[2] = '\0';
    acStack_f8[3] = '\0';
    acStack_f8[4] = '\0';
    acStack_f8[5] = '\0';
    acStack_f8[6] = '\0';
    acStack_f8[7] = '\0';
    buf2._M_elems[0] = '\0';
    buf2._M_elems[1] = '\0';
    buf2._M_elems[2] = '\0';
    buf2._M_elems[3] = '\0';
    buf2._M_elems[4] = '\0';
    buf2._M_elems[5] = '\0';
    buf2._M_elems[6] = '\0';
    buf2._M_elems[7] = '\0';
    local_48 = buf1._M_elems + 0x3a;
    local_b0.m_czero = '0';
    local_b0.m_zero = 0x30;
    puStack_100 = (undefined1 *)0x106800;
    local_b0.m_value = (type)x;
    local_b0.m_finish = pcVar1;
    local_40 = pcVar1;
    local_48 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_short,_char>::
               convert(&local_b0);
    uVar11 = (long)pcVar1 - (long)local_48;
    if (0x3f < uVar11) {
      buf1._M_elems._56_8_ = &PTR__bad_cast_0010fd30;
      local_50 = &unsigned_short::typeinfo;
      local_48 = (char *)&std::array<char,64ul>::typeinfo;
      puStack_100 = &LAB_0010691a;
      local_40 = pcVar1;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)(buf1._M_elems + 0x38));
    }
    puStack_100 = (undefined1 *)0x106826;
    local_40 = pcVar1;
    memcpy(acStack_f8,local_48,uVar11);
    *(undefined1 *)((long)&buf2 + (uVar11 - 8)) = 0;
    puStack_100 = (undefined1 *)0x10683a;
    iVar8 = strcmp((char *)&local_98,acStack_f8);
    if (iVar8 != 0) {
      puStack_100 = (undefined1 *)0x106881;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
      puStack_100 = (undefined1 *)0x106890;
      sVar10 = strlen((char *)&local_98);
      puStack_100 = (undefined1 *)0x1068a2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)&local_98,sVar10);
      puStack_100 = (undefined1 *)0x1068ba;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
      puStack_100 = (undefined1 *)0x1068c9;
      sVar10 = strlen(acStack_f8);
      puStack_100 = (undefined1 *)0x1068db;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,acStack_f8,sVar10);
      puStack_100 = (undefined1 *)0x1068e7;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puStack_100 = (undefined1 *)0x1068f1;
      exit(1);
    }
    x = x + 1;
  } while (x != 0xffff);
  puStack_100 = (undefined1 *)0x106857;
  TestWatcher<unsigned_short>::~TestWatcher(local_31);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }